

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O0

void __thiscall
DynamicKReach::resume_bfs
          (DynamicKReach *this,vertex_t s,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  value_type vVar2;
  uint v;
  uint uVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  byte *pbVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  reference puVar9;
  size_type sVar10;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  value_type cur;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vertex_t s_local;
  DynamicKReach *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pvVar5 == '?') {
    __assert_fail("dist.at(s) != INF8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicKReach.cpp"
                  ,0xa2,"void DynamicKReach::resume_bfs(vertex_t, std::vector<distance_t> &)");
  }
  sVar10 = this->back_;
  this->back_ = sVar10 + 1;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,sVar10);
  *pvVar6 = s;
  while (this->back_ != this->front_) {
    sVar10 = this->front_;
    this->front_ = sVar10 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,sVar10);
    v = *pvVar6;
    pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
    if (*pbVar7 < this->k_) {
      pvVar8 = Graph::successors(this->graph_,v);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar8);
      nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar8);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&nxt), bVar4) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar9)
        ;
        bVar1 = *pbVar7;
        pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
        if (*pbVar7 + 1 < (uint)bVar1) {
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
          vVar2 = *pvVar5;
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar9);
          *pvVar5 = vVar2 + '\x01';
          pvVar8 = Graph::successors(this->graph_,*puVar9);
          sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
          if (sVar10 != 0) {
            uVar3 = *puVar9;
            sVar10 = this->back_;
            this->back_ = sVar10 + 1;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&this->queue_,sVar10);
            *pvVar6 = uVar3;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::resume_bfs(vertex_t s, std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (graph_.successors(nxt).size() > 0) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}